

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int GetLast360DataFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,int *pNbMeasurements)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  reference pdVar4;
  long lVar5;
  ulong __n;
  CRITICAL_SECTION *__mutex;
  long lVar6;
  
  __mutex = RPLIDARCS;
  lVar6 = 0;
  lVar5 = 0;
  do {
    if (*(RPLIDAR **)((long)addrsRPLIDAR + lVar6 * 2) == pRPLIDAR) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      sVar3 = std::deque<double,_std::allocator<double>_>::size
                        ((deque<double,_std::allocator<double>_> *)
                         ((long)&anglesvectorRPLIDAR[0].
                                 super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                 super__Deque_impl_data._M_map + lVar5));
      *pNbMeasurements = (int)sVar3;
      __n = sVar3 & 0xffffffff;
      while (__n = __n - 1, 0 < (int)__n + 1) {
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           ((_Deque_iterator<double,_double_&,_double_*> *)
                            ((long)&anglesvectorRPLIDAR[0].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_start._M_cur + lVar5),__n);
        pAngles[__n] = *pdVar4;
        pdVar4 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           ((_Deque_iterator<double,_double_&,_double_*> *)
                            ((long)&distancesvectorRPLIDAR[0].
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_start._M_cur + lVar5),__n);
        pDistances[__n] = *pdVar4;
      }
      iVar1 = *(int *)((long)resRPLIDAR + lVar6);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      iVar2 = 2;
      if (0 < *pNbMeasurements) {
        iVar2 = iVar1;
      }
      return iVar2;
    }
    lVar5 = lVar5 + 0x50;
    __mutex = __mutex + 1;
    lVar6 = lVar6 + 4;
  } while (lVar5 != 0x500);
  return 1;
}

Assistant:

HARDWAREX_API int GetLast360DataFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, int* pNbMeasurements)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	*pNbMeasurements = (int)anglesvectorRPLIDAR[id].size();
	for (int i = *pNbMeasurements-1; i >= 0; i--)
	{
		pAngles[i] = anglesvectorRPLIDAR[id][i];
		pDistances[i] = distancesvectorRPLIDAR[id][i];
	}
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	if (*pNbMeasurements <= 0) return EXIT_TIMEOUT;
	return res;
#else
	return EXIT_NOT_IMPLEMENTED;
#endif // __cplusplus
}